

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall FormatTest_FixedEnum_Test::TestBody(FormatTest_FixedEnum_Test *this)

{
  undefined1 uVar1;
  Message *in_stack_00000008;
  AssertHelper *in_stack_00000010;
  AssertionResult gtest_ar;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  char (*expected) [2];
  char *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  Type in_stack_ffffffffffffffbc;
  uint6 in_stack_ffffffffffffffc0;
  undefined2 uVar2;
  char (*in_stack_ffffffffffffffc8) [3];
  AssertionResult local_18;
  
  uVar2 = 0;
  expected = (char (*) [2])&stack0xffffffffffffffc8;
  fmt::v5::format<char[3],TestFixedEnum>
            (in_stack_ffffffffffffffc8,(TestFixedEnum *)(ulong)in_stack_ffffffffffffffc0);
  testing::internal::EqHelper<false>::Compare<char[2],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             in_stack_ffffffffffffffa0,expected,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)CONCAT26(uVar2,in_stack_ffffffffffffffc0));
    testing::AssertionResult::failure_message((AssertionResult *)0x17e3d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT26(uVar2,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc,
               in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0);
    testing::internal::AssertHelper::operator=(in_stack_00000010,in_stack_00000008);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff90));
    testing::Message::~Message((Message *)0x17e41c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17e45c);
  return;
}

Assistant:

TEST(FormatTest, FixedEnum) {
  EXPECT_EQ("0", fmt::format("{}", B));
}